

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O1

void __thiscall spoa::Graph::TopologicalSort(Graph *this)

{
  uint uVar1;
  pointer ppEVar2;
  Node *pNVar3;
  pointer ppNVar4;
  bool bVar5;
  _Elt_pointer ppNVar6;
  Edge **jt;
  pointer ppEVar7;
  pointer puVar8;
  Node **jt_1;
  pointer ppNVar9;
  value_type curr;
  vector<bool,_std::allocator<bool>_> ignored;
  vector<unsigned_char,_std::allocator<unsigned_char>_> marks;
  stack<spoa::Graph::Node_*,_std::deque<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>_>
  stack;
  _Head_base<0UL,_spoa::Graph::Node_*,_false> local_d8;
  vector<bool,_std::allocator<bool>_> local_d0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a8;
  Graph *local_90;
  _Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_> local_88;
  pointer local_38;
  
  ppNVar9 = (this->rank_to_node_).
            super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->rank_to_node_).
      super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppNVar9) {
    (this->rank_to_node_).
    super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppNVar9;
  }
  local_88._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)((ulong)local_88._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_a8,
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(value_type_conflict4 *)&local_88,
             (allocator_type *)&local_d0);
  local_88._M_impl.super__Deque_impl_data._M_map =
       (_Map_pointer)((ulong)local_88._M_impl.super__Deque_impl_data._M_map & 0xffffffffffffff00);
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_d0,
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->nodes_).
                   super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3,(bool *)&local_88,
             (allocator_type *)&local_d8);
  local_88._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_88._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  std::_Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::_M_initialize_map
            (&local_88,0);
  puVar8 = (this->nodes_).
           super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_38 = (this->nodes_).
             super__Vector_base<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>,_std::allocator<std::unique_ptr<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  local_90 = this;
  if (puVar8 != local_38) {
    do {
      if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start
          [((puVar8->_M_t).
            super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>._M_t.
            super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
            super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl)->id] == '\0') {
        local_d8._M_head_impl =
             (puVar8->_M_t).
             super___uniq_ptr_impl<spoa::Graph::Node,_std::default_delete<spoa::Graph::Node>_>._M_t.
             super__Tuple_impl<0UL,_spoa::Graph::Node_*,_std::default_delete<spoa::Graph::Node>_>.
             super__Head_base<0UL,_spoa::Graph::Node_*,_false>._M_head_impl;
        std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
        emplace_back<spoa::Graph::Node*>
                  ((deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)&local_88,
                   &local_d8._M_head_impl);
        while (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               local_88._M_impl.super__Deque_impl_data._M_start._M_cur) {
          ppNVar6 = local_88._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
            ppNVar6 = local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
          }
          local_d8._M_head_impl = ppNVar6[-1];
          bVar5 = true;
          if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[(local_d8._M_head_impl)->id] != '\x02') {
            ppEVar2 = ((local_d8._M_head_impl)->inedges).
                      super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            bVar5 = true;
            for (ppEVar7 = ((local_d8._M_head_impl)->inedges).
                           super__Vector_base<spoa::Graph::Edge_*,_std::allocator<spoa::Graph::Edge_*>_>
                           ._M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar2;
                ppEVar7 = ppEVar7 + 1) {
              pNVar3 = (*ppEVar7)->tail;
              if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[pNVar3->id] != '\x02') {
                if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                  std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                  _M_push_back_aux<spoa::Graph::Node*const&>
                            ((deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                             &local_88,&(*ppEVar7)->tail);
                }
                else {
                  *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = pNVar3;
                  local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                       local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                }
                bVar5 = false;
              }
            }
            if ((local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                 super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                 [(local_d8._M_head_impl)->id >> 6] >> ((ulong)(local_d8._M_head_impl)->id & 0x3f) &
                1) == 0) {
              ppNVar4 = ((local_d8._M_head_impl)->aligned_nodes).
                        super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
              for (ppNVar9 = ((local_d8._M_head_impl)->aligned_nodes).
                             super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                             ._M_impl.super__Vector_impl_data._M_start; ppNVar9 != ppNVar4;
                  ppNVar9 = ppNVar9 + 1) {
                if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start[(*ppNVar9)->id] != '\x02') {
                  if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                      local_88._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
                    std::deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                    _M_push_back_aux<spoa::Graph::Node*const&>
                              ((deque<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                               &local_88,ppNVar9);
                  }
                  else {
                    *local_88._M_impl.super__Deque_impl_data._M_finish._M_cur = *ppNVar9;
                    local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                         local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
                  }
                  local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                  [(*ppNVar9)->id >> 6] =
                       local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                       [(*ppNVar9)->id >> 6] | 1L << ((ulong)(*ppNVar9)->id & 0x3f);
                  bVar5 = false;
                }
              }
            }
            uVar1 = (local_d8._M_head_impl)->id;
            if (bVar5) {
              local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar1] = '\x02';
              if ((local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
                   [(local_d8._M_head_impl)->id >> 6] >> ((ulong)(local_d8._M_head_impl)->id & 0x3f)
                  & 1) == 0) {
                std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                emplace_back<spoa::Graph::Node*&>
                          ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                           &this->rank_to_node_,&local_d8._M_head_impl);
                ppNVar4 = ((local_d8._M_head_impl)->aligned_nodes).
                          super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish;
                for (ppNVar9 = ((local_d8._M_head_impl)->aligned_nodes).
                               super__Vector_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>
                               ._M_impl.super__Vector_impl_data._M_start; ppNVar9 != ppNVar4;
                    ppNVar9 = ppNVar9 + 1) {
                  std::vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>>::
                  emplace_back<spoa::Graph::Node*const&>
                            ((vector<spoa::Graph::Node*,std::allocator<spoa::Graph::Node*>> *)
                             &this->rank_to_node_,ppNVar9);
                }
              }
            }
            else {
              if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                  .super__Vector_impl_data._M_start[uVar1] == '\x01') {
                __assert_fail("(is_valid || marks[curr->id] != 1) && \"Graph is not a DAG\"",
                              "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]spoa/src/graph.cpp"
                              ,0x119,"void spoa::Graph::TopologicalSort()");
              }
              local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start[uVar1] = '\x01';
            }
          }
          if (bVar5) {
            if (local_88._M_impl.super__Deque_impl_data._M_finish._M_cur ==
                local_88._M_impl.super__Deque_impl_data._M_finish._M_first) {
              operator_delete(local_88._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
              local_88._M_impl.super__Deque_impl_data._M_finish._M_first =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
              local_88._M_impl.super__Deque_impl_data._M_finish._M_last =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x40;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_first + 0x3f;
              local_88._M_impl.super__Deque_impl_data._M_finish._M_node =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
            }
            else {
              local_88._M_impl.super__Deque_impl_data._M_finish._M_cur =
                   local_88._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
            }
          }
        }
      }
      puVar8 = puVar8 + 1;
    } while (puVar8 != local_38);
  }
  bVar5 = IsTopologicallySorted(local_90);
  if (!bVar5) {
    __assert_fail("IsTopologicallySorted() && \"Graph is not topologically sorted\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/rvaser[P]spoa/src/graph.cpp",
                  0x12e,"void spoa::Graph::TopologicalSort()");
  }
  std::_Deque_base<spoa::Graph::Node_*,_std::allocator<spoa::Graph::Node_*>_>::~_Deque_base
            (&local_88);
  if (local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    local_d0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
  }
  if (local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Graph::TopologicalSort() {
  rank_to_node_.clear();

  std::vector<std::uint8_t> marks(nodes_.size(), 0);
  std::vector<bool> ignored(nodes_.size(), 0);

  std::stack<Node*> stack;
  for (const auto& it : nodes_) {
    if (marks[it->id] != 0) {
      continue;
    }
    stack.push(it.get());
    while (!stack.empty()) {
      auto curr = stack.top();
      bool is_valid = true;
      if (marks[curr->id] != 2) {
        for (const auto& jt : curr->inedges) {
          if (marks[jt->tail->id] != 2) {
            stack.push(jt->tail);
            is_valid = false;
          }
        }
        if (!ignored[curr->id]) {
          for (const auto& jt : curr->aligned_nodes) {
            if (marks[jt->id] != 2) {
              stack.push(jt);
              ignored[jt->id] = true;
              is_valid = false;
            }
          }
        }

        assert((is_valid || marks[curr->id] != 1) && "Graph is not a DAG");

        if (is_valid) {
          marks[curr->id] = 2;
          if (!ignored[curr->id]) {
            rank_to_node_.emplace_back(curr);
            for (const auto& jt : curr->aligned_nodes) {
              rank_to_node_.emplace_back(jt);
            }
          }
        } else {
          marks[curr->id] = 1;
        }
      }

      if (is_valid) {
        stack.pop();
      }
    }
  }

  assert(IsTopologicallySorted() && "Graph is not topologically sorted");
}